

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O3

void SHA224_256ProcessMessageBlock(SHA256Context *context)

{
  byte bVar1;
  undefined1 uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [16];
  long lVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  uint uVar30;
  uint uVar31;
  uint32_t uVar32;
  undefined1 auVar33 [16];
  uint uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uStack_174;
  uint local_15c;
  int local_154 [5];
  uint local_140 [68];
  
  lVar22 = 0x39;
  do {
    auVar21._1_4_ = (uint)*(byte *)((long)context->Intermediate_Hash + lVar22 + -0xb) << 0x18;
    auVar21[0] = *(undefined1 *)((long)context->Intermediate_Hash + lVar22 + -0xf);
    auVar21._5_4_ = (uint)*(byte *)((long)context->Intermediate_Hash + lVar22 + -7) << 0x18;
    auVar21._9_4_ = (uint)*(byte *)((long)context->Intermediate_Hash + lVar22 + -3) << 0x18;
    auVar21._13_3_ = 0;
    bVar1 = *(byte *)((long)context->Intermediate_Hash + lVar22 + -10);
    auVar9[1] = 0;
    auVar9[0] = bVar1;
    auVar16._12_2_ = 0;
    auVar16._0_12_ = SUB1612((undefined1  [16])0x0,0);
    auVar16[0xe] = *(undefined1 *)((long)context->Intermediate_Hash + lVar22 + -2);
    auVar17[10] = *(undefined1 *)((long)context->Intermediate_Hash + lVar22 + -6);
    auVar17._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar17[0xb] = 0;
    auVar17._12_3_ = auVar16._12_3_;
    auVar18._10_5_ = auVar17._10_5_;
    auVar18._0_10_ = (unkuint10)0;
    auVar9._2_7_ = auVar18._8_7_;
    auVar9._9_7_ = 0;
    auVar33._4_12_ = SUB1612(auVar9 << 0x30,4);
    auVar33._0_4_ =
         (CONCAT11(bVar1,*(undefined1 *)((long)context->Intermediate_Hash + lVar22 + -0xe)) & 0xff)
         << 0x10;
    uVar2 = *(undefined1 *)((long)context->Intermediate_Hash + lVar22 + -9);
    auVar10[0xc] = *(undefined1 *)((long)context->Intermediate_Hash + lVar22 + -1);
    auVar10._0_12_ = ZEXT812(0);
    auVar11._10_3_ = auVar10._10_3_;
    auVar11._0_10_ = (unkuint10)*(byte *)((long)context->Intermediate_Hash + lVar22 + -5) << 0x40;
    auVar19._5_8_ = 0;
    auVar19._0_5_ = auVar11._8_5_;
    uVar34 = CONCAT13(0,CONCAT12(uVar2,(ushort)*(byte *)((long)context->Intermediate_Hash +
                                                        lVar22 + -0xd)));
    auVar12[4] = uVar2;
    auVar12._0_4_ = uVar34;
    auVar12[5] = 0;
    auVar12._6_7_ = SUB137(auVar19 << 0x40,6);
    auVar35._0_4_ = (uVar34 & 0xffff) << 8;
    auVar35._4_4_ = auVar12._4_4_ << 8;
    auVar35._8_4_ = auVar11._8_4_ << 8;
    auVar35._12_4_ = (uint)(uint3)(auVar10._10_3_ >> 0x10) << 8;
    uVar2 = *(undefined1 *)((long)context->Intermediate_Hash + lVar22 + -8);
    auVar13[0xc] = *(undefined1 *)((long)context->Intermediate_Hash + lVar22);
    auVar13._0_12_ = ZEXT812(0);
    auVar14._10_3_ = auVar13._10_3_;
    auVar14._0_10_ = (unkuint10)*(byte *)((long)context->Intermediate_Hash + lVar22 + -4) << 0x40;
    auVar20._5_8_ = 0;
    auVar20._0_5_ = auVar14._8_5_;
    uVar34 = CONCAT13(0,CONCAT12(uVar2,(ushort)*(byte *)((long)context->Intermediate_Hash +
                                                        lVar22 + -0xc)));
    auVar15[4] = uVar2;
    auVar15._0_4_ = uVar34;
    auVar15[5] = 0;
    auVar15._6_7_ = SUB137(auVar20 << 0x40,6);
    auVar36._0_4_ = uVar34 & 0xffff;
    auVar36._4_9_ = auVar15._4_9_;
    auVar36._13_3_ = 0;
    *(undefined1 (*) [16])((long)&uStack_174 + lVar22 + 3) =
         auVar36 | auVar35 | auVar33 | auVar21 << 0x18;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x79);
  lVar22 = 0x10;
  do {
    uVar34 = (&uStack_174)[lVar22];
    uVar3 = local_140[lVar22];
    local_140[lVar22 + 2] =
         (uVar34 >> 3 ^ (uVar34 << 0xe | uVar34 >> 0x12) ^ (uVar34 << 0x19 | uVar34 >> 7)) +
         local_140[2] +
         (uVar3 >> 10 ^ (uVar3 << 0xd | uVar3 >> 0x13) ^ (uVar3 << 0xf | uVar3 >> 0x11)) +
         local_154[lVar22];
    lVar22 = lVar22 + 1;
    local_140[2] = uVar34;
  } while (lVar22 != 0x40);
  uVar4 = context->Intermediate_Hash[1];
  uVar34 = context->Intermediate_Hash[2];
  uVar3 = context->Intermediate_Hash[3];
  uVar5 = context->Intermediate_Hash[4];
  uVar6 = context->Intermediate_Hash[5];
  uVar7 = context->Intermediate_Hash[6];
  uVar8 = context->Intermediate_Hash[7];
  lVar22 = 0;
  uVar29 = context->Intermediate_Hash[0];
  uVar28 = uVar4;
  uVar27 = uVar34;
  uVar32 = uVar5;
  uVar31 = uVar6;
  uVar23 = uVar7;
  uVar30 = uVar8;
  local_15c = uVar3;
  do {
    uVar24 = uVar23;
    uVar23 = uVar31;
    uVar31 = uVar32;
    uVar26 = uVar27;
    uVar27 = uVar28;
    uVar28 = uVar29;
    iVar25 = ((uVar23 ^ uVar24) & uVar31 ^ uVar24) + uVar30 +
             ((uVar31 << 7 | uVar31 >> 0x19) ^
             (uVar31 << 0x15 | uVar31 >> 0xb) ^ (uVar31 << 0x1a | uVar31 >> 6)) +
             *(int *)((long)SHA224_256ProcessMessageBlock::K + lVar22) +
             *(int *)((long)local_140 + lVar22 + 8);
    uVar32 = local_15c + iVar25;
    uVar29 = (uVar26 & uVar27 ^ (uVar26 ^ uVar27) & uVar28) +
             ((uVar28 << 10 | uVar28 >> 0x16) ^
             (uVar28 << 0x13 | uVar28 >> 0xd) ^ (uVar28 << 0x1e | uVar28 >> 2)) + iVar25;
    lVar22 = lVar22 + 4;
    uVar30 = uVar24;
    local_15c = uVar26;
  } while (lVar22 != 0x100);
  context->Intermediate_Hash[0] = uVar29 + context->Intermediate_Hash[0];
  context->Intermediate_Hash[1] = uVar28 + uVar4;
  context->Intermediate_Hash[2] = uVar27 + uVar34;
  context->Intermediate_Hash[3] = uVar26 + uVar3;
  context->Intermediate_Hash[4] = uVar32 + uVar5;
  context->Intermediate_Hash[5] = uVar31 + uVar6;
  context->Intermediate_Hash[6] = uVar23 + uVar7;
  context->Intermediate_Hash[7] = uVar24 + uVar8;
  context->Message_Block_Index = 0;
  return;
}

Assistant:

static void SHA224_256ProcessMessageBlock(SHA256Context *context)
{
    /* Constants defined in FIPS-180-2, section 4.2.2 */
    static const uint32_t K[64] = {
        0x428a2f98, 0x71374491, 0xb5c0fbcf, 0xe9b5dba5, 0x3956c25b,
        0x59f111f1, 0x923f82a4, 0xab1c5ed5, 0xd807aa98, 0x12835b01,
        0x243185be, 0x550c7dc3, 0x72be5d74, 0x80deb1fe, 0x9bdc06a7,
        0xc19bf174, 0xe49b69c1, 0xefbe4786, 0x0fc19dc6, 0x240ca1cc,
        0x2de92c6f, 0x4a7484aa, 0x5cb0a9dc, 0x76f988da, 0x983e5152,
        0xa831c66d, 0xb00327c8, 0xbf597fc7, 0xc6e00bf3, 0xd5a79147,
        0x06ca6351, 0x14292967, 0x27b70a85, 0x2e1b2138, 0x4d2c6dfc,
        0x53380d13, 0x650a7354, 0x766a0abb, 0x81c2c92e, 0x92722c85,
        0xa2bfe8a1, 0xa81a664b, 0xc24b8b70, 0xc76c51a3, 0xd192e819,
        0xd6990624, 0xf40e3585, 0x106aa070, 0x19a4c116, 0x1e376c08,
        0x2748774c, 0x34b0bcb5, 0x391c0cb3, 0x4ed8aa4a, 0x5b9cca4f,
        0x682e6ff3, 0x748f82ee, 0x78a5636f, 0x84c87814, 0x8cc70208,
        0x90befffa, 0xa4506ceb, 0xbef9a3f7, 0xc67178f2
    };
    int        t, t4;                   /* Loop counter */
    uint32_t   temp1, temp2;            /* Temporary word value */
    uint32_t   W[64];                   /* Word sequence */
    uint32_t   A, B, C, D, E, F, G, H;  /* Word buffers */

    /*
    * Initialize the first 16 words in the array W
    */
    for (t = t4 = 0; t < 16; t++, t4 += 4)
    {
        W[t] = (((uint32_t)context->Message_Block[t4]) << 24) |
            (((uint32_t)context->Message_Block[t4 + 1]) << 16) |
            (((uint32_t)context->Message_Block[t4 + 2]) << 8) |
            (((uint32_t)context->Message_Block[t4 + 3]));
    }
    for (t = 16; t < 64; t++)
    {
        W[t] = SHA256_sigma1(W[t - 2]) + W[t - 7] +
            SHA256_sigma0(W[t - 15]) + W[t - 16];
    }
    A = context->Intermediate_Hash[0];
    B = context->Intermediate_Hash[1];
    C = context->Intermediate_Hash[2];
    D = context->Intermediate_Hash[3];
    E = context->Intermediate_Hash[4];
    F = context->Intermediate_Hash[5];
    G = context->Intermediate_Hash[6];
    H = context->Intermediate_Hash[7];

    for (t = 0; t < 64; t++)
    {
        temp1 = H + SHA256_SIGMA1(E) + SHA_Ch(E, F, G) + K[t] + W[t];
        temp2 = SHA256_SIGMA0(A) + SHA_Maj(A, B, C);
        H = G;
        G = F;
        F = E;
        E = D + temp1;
        D = C;
        C = B;
        B = A;
        A = temp1 + temp2;
    }

    context->Intermediate_Hash[0] += A;
    context->Intermediate_Hash[1] += B;
    context->Intermediate_Hash[2] += C;
    context->Intermediate_Hash[3] += D;
    context->Intermediate_Hash[4] += E;
    context->Intermediate_Hash[5] += F;
    context->Intermediate_Hash[6] += G;
    context->Intermediate_Hash[7] += H;

    context->Message_Block_Index = 0;
}